

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

Block * __thiscall soul::ModuleCloner::getRemappedBlock(ModuleCloner *this,Block *old)

{
  mapped_type *this_00;
  Block *pBVar1;
  pool_ref<const_soul::heart::Block> local_20;
  Block *local_18;
  Block *old_local;
  ModuleCloner *this_local;
  
  local_18 = old;
  old_local = (Block *)this;
  pool_ref<soul::heart::Block_const>::pool_ref<soul::heart::Block,void>
            ((pool_ref<soul::heart::Block_const> *)&local_20,old);
  this_00 = std::
            unordered_map<soul::pool_ref<const_soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>,_std::hash<soul::pool_ref<const_soul::heart::Block>_>,_std::equal_to<soul::pool_ref<const_soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>_>
            ::operator[](&this->blockMappings,(key_type *)&local_20);
  pBVar1 = pool_ptr<soul::heart::Block>::operator*(this_00);
  pool_ref<const_soul::heart::Block>::~pool_ref(&local_20);
  return pBVar1;
}

Assistant:

heart::Block& getRemappedBlock (heart::Block& old)                          { return *blockMappings[old]; }